

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O3

bool okResize<double>(vector<double,_std::allocator<double>_> *use_vector,HighsInt dimension,
                     double value)

{
  double local_10;
  
  local_10 = value;
  std::vector<double,_std::allocator<double>_>::resize(use_vector,(long)dimension,&local_10);
  return true;
}

Assistant:

bool okResize(std::vector<T>& use_vector, HighsInt dimension, T value = T{}) {
  try {
    use_vector.resize(dimension, value);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okResize fails with %s\n", e.what());
    return false;
  }
  return true;
}